

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON_IsUTF8Encoded(bool bSloppy,char *buffer,int buffer_length)

{
  int iVar1;
  ON__UINT32 local_4c;
  ON_UnicodeErrorParameters *local_48;
  undefined1 local_40 [8];
  ON_UnicodeErrorParameters e;
  int i;
  int delta_i;
  ON__UINT32 unicode_code_point;
  ON_UnicodeErrorParameters e0;
  int buffer_length_local;
  char *buffer_local;
  bool bSloppy_local;
  
  if (buffer == (char *)0x0) {
    buffer_local._7_1_ = false;
  }
  else {
    e0.m_error_mask = buffer_length;
    unique0x100000b8 = buffer;
    if (buffer_length == -1) {
      e0.m_error_mask = ON_String::Length(buffer);
    }
    if (((int)e0.m_error_mask < 1) || (0xfffffffe < (ulong)(long)(int)e0.m_error_mask)) {
      buffer_local._7_1_ = false;
    }
    else {
      if (bSloppy) {
        local_48 = &ON_UnicodeErrorParameters::FailOnErrors;
      }
      else {
        local_48 = &ON_UnicodeErrorParameters::MaskErrors;
      }
      delta_i = local_48->m_error_status;
      unicode_code_point = local_48->m_error_mask;
      e0.m_error_status = 0x110000;
      e.m_error_code_point = 0;
      for (e.m_error_mask = 0; (int)e.m_error_mask < (int)e0.m_error_mask;
          e.m_error_mask = local_4c + e.m_error_mask) {
        local_40._0_4_ = delta_i;
        local_40._4_4_ = unicode_code_point;
        e.m_error_status = e0.m_error_status;
        i = 0x110000;
        e.m_error_code_point =
             ON_DecodeUTF8(stack0xffffffffffffffe8 + (int)e.m_error_mask,
                           e0.m_error_mask - e.m_error_mask,(ON_UnicodeErrorParameters *)local_40,
                           (ON__UINT32 *)&i);
        if ((((int)e.m_error_code_point < 1) || (iVar1 = ON_IsValidUnicodeCodePoint(i), iVar1 == 0))
           || ((int)e0.m_error_mask < (int)(e.m_error_mask + e.m_error_code_point))) {
          return false;
        }
        if ((int)e.m_error_code_point < 1) {
          local_4c = 1;
        }
        else {
          local_4c = e.m_error_code_point;
        }
      }
      buffer_local._7_1_ = true;
    }
  }
  return buffer_local._7_1_;
}

Assistant:

static bool ON_IsUTF8Encoded(bool bSloppy, const char* buffer, int buffer_length)
{
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return false;

  struct ON_UnicodeErrorParameters e0
    = bSloppy
    ? ON_UnicodeErrorParameters::FailOnErrors
    : ON_UnicodeErrorParameters::MaskErrors;
  e0.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
  ON__UINT32 unicode_code_point;
  int delta_i = 0;
  for (int i = 0; i < buffer_length; i += (delta_i > 0) ? delta_i : 1)
  {
    struct ON_UnicodeErrorParameters e = e0;
    unicode_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta_i = ON_DecodeUTF8(buffer + i, buffer_length - i, &e, &unicode_code_point);
    if (delta_i > 0 && ON_IsValidUnicodeCodePoint(unicode_code_point) && i + delta_i <= buffer_length)
      continue;
    return false;
  }

  return true;
}